

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetailedHelloWorld.cpp
# Opt level: O0

int main(void)

{
  byte bVar1;
  Severity SVar2;
  cx_string<2UL> cVar3;
  _Ios_Openmode _Var4;
  Session *this;
  uint64_t eventSourceId;
  bool bVar5;
  ofstream logfile;
  uint64_t _binlog_sid_v;
  SessionWriter writer;
  Session session;
  memory_order __b;
  memory_order __b_1;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  EventSource *in_stack_fffffffffffffb00;
  char (*in_stack_fffffffffffffb08) [10];
  atomic<unsigned_long> *in_stack_fffffffffffffb10;
  EventSource *eventSource;
  Session *in_stack_fffffffffffffb70;
  allocator *paVar6;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  uint64_t in_stack_fffffffffffffb98;
  atomic<unsigned_long> *paVar7;
  undefined4 in_stack_fffffffffffffba0;
  undefined2 in_stack_fffffffffffffba4;
  undefined2 in_stack_fffffffffffffba6;
  Session *in_stack_fffffffffffffba8;
  SessionWriter *this_00;
  long local_418 [10];
  basic_ofstream<char,_std::char_traits<char>_> *in_stack_fffffffffffffc38;
  Session *in_stack_fffffffffffffc40;
  undefined1 local_210 [3];
  char local_20d;
  allocator local_20c;
  allocator local_20b;
  allocator local_20a;
  allocator local_209;
  undefined8 local_208;
  undefined2 local_200;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  undefined8 local_198;
  string local_190 [32];
  string local_170 [32];
  EventSource *local_150;
  string local_138 [32];
  SessionWriter local_118;
  SessionWriter local_e8 [3];
  uint local_3c;
  EventSource *local_38;
  memory_order local_30;
  int local_2c;
  atomic<unsigned_long> *local_28;
  EventSource *local_20;
  memory_order local_18;
  int local_14;
  EventSource *local_10;
  atomic<unsigned_long> *local_8;
  
  local_3c = 0;
  this_00 = local_e8;
  binlog::Session::Session(in_stack_fffffffffffffb70);
  std::__cxx11::string::string(local_138);
  binlog::SessionWriter::SessionWriter
            (this_00,in_stack_fffffffffffffba8,
             CONCAT26(in_stack_fffffffffffffba6,
                      CONCAT24(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0)),
             in_stack_fffffffffffffb98,
             (string *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  std::__cxx11::string::~string(local_138);
  binlog::SessionWriter::session(&local_118);
  SVar2 = binlog::Session::minSeverity((Session *)0x1024c5);
  if (SVar2 < 0x81) {
    local_28 = &main::_binlog_sid;
    local_2c = 0;
    paVar7 = &main::_binlog_sid;
    local_30 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_2c - 1U < 2) {
      local_38 = (EventSource *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_2c == 5) {
      local_38 = (EventSource *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_38 = (EventSource *)(paVar7->super___atomic_base<unsigned_long>)._M_i;
    }
    local_150 = local_38;
    if (local_38 == (EventSource *)0x0) {
      binlog::SessionWriter::session(&local_118);
      local_208._0_2_ = 0;
      local_208._2_6_ = 0;
      local_200._0_1_ = (string)0x80;
      local_200._1_1_ = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,"main",&local_209);
      paVar6 = &local_20a;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"main",paVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/example/DetailedHelloWorld.cpp"
                 ,&local_20b);
      local_198._0_1_ = (string)0xd;
      local_198._1_7_ = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,"Hello {}!",&local_20c);
      cVar3 = binlog::detail::concatenated_tags<char_const(&)[10],char_const(&)[6]>
                        (in_stack_fffffffffffffb08,(char (*) [6])in_stack_fffffffffffffb00);
      local_210._1_2_ = cVar3._data._0_2_;
      local_20d = cVar3._data[2];
      this = (Session *)mserialize::cx_string<2UL>::data((cx_string<2UL> *)(local_210 + 1));
      eventSource = (EventSource *)local_210;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,(char *)this,(allocator *)eventSource);
      local_150 = (EventSource *)binlog::Session::addEventSource(this,eventSource);
      binlog::EventSource::~EventSource(in_stack_fffffffffffffb00);
      std::allocator<char>::~allocator((allocator<char> *)local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_20c);
      std::allocator<char>::~allocator((allocator<char> *)&local_20b);
      std::allocator<char>::~allocator((allocator<char> *)&local_20a);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      local_8 = &main::_binlog_sid;
      local_10 = local_150;
      local_14 = 5;
      in_stack_fffffffffffffb10 = &main::_binlog_sid;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10;
      if (local_14 == 3) {
        ((__atomic_base<unsigned_long> *)&((SessionWriter *)in_stack_fffffffffffffb10)->_session)->
        _M_i = (__int_type)local_10;
      }
      else if (local_14 == 5) {
        LOCK();
        ((__atomic_base<unsigned_long> *)&((SessionWriter *)in_stack_fffffffffffffb10)->_session)->
        _M_i = (__int_type)local_10;
        UNLOCK();
      }
      else {
        ((__atomic_base<unsigned_long> *)&((SessionWriter *)in_stack_fffffffffffffb10)->_session)->
        _M_i = (__int_type)local_10;
      }
    }
    in_stack_fffffffffffffb00 = local_150;
    eventSourceId = binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[10],char_const(&)[6]>
              ((SessionWriter *)in_stack_fffffffffffffb10,eventSourceId,
               (uint64_t)in_stack_fffffffffffffb00,
               (char (*) [10])CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               (char (*) [6])0x102a9f);
  }
  _Var4 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(local_418,"hello.blog",_Var4);
  binlog::Session::consume<std::ofstream>(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  bVar1 = std::ios::operator!((ios *)((long)local_418 + *(long *)(local_418[0] + -0x18)));
  bVar5 = (bVar1 & 1) != 0;
  if (bVar5) {
    std::operator<<((ostream *)&std::cerr,"Failed to write hello.blog\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"Binary log written to hello.blog\n");
  }
  local_3c = (uint)bVar5;
  std::ofstream::~ofstream(local_418);
  binlog::SessionWriter::~SessionWriter((SessionWriter *)0x102bb7);
  binlog::Session::~Session((Session *)in_stack_fffffffffffffb00);
  return local_3c;
}

Assistant:

int main()
{
  binlog::Session session;
  binlog::SessionWriter writer(session);

  BINLOG_INFO_W(writer, "Hello {}!", "World");

  std::ofstream logfile("hello.blog", std::ofstream::out|std::ofstream::binary);
  session.consume(logfile);

  if (! logfile)
  {
    std::cerr << "Failed to write hello.blog\n";
    return 1;
  }

  std::cout << "Binary log written to hello.blog\n";
  return 0;
}